

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
optTyped_valueConstructorRvalue_Test<mp::opt<long,_mp::opt_null_value_policy<long,_-1L>_>_>::
~optTyped_valueConstructorRvalue_Test
          (optTyped_valueConstructorRvalue_Test<mp::opt<long,_mp::opt_null_value_policy<long,__1L>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TYPED_TEST(optTyped, valueConstructorRvalue)
{
  using opt_type = typename TestFixture::type;
  auto make = [&] { return opt_type{this->value_1}; };
  EXPECT_TRUE(make());
  EXPECT_TRUE(make().has_value());
  EXPECT_EQ(this->value_1, *make());
  EXPECT_EQ(this->value_1, make().value());
  EXPECT_EQ(this->value_1, make().value_or(this->value_2));
}